

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::doEndBlock
               (ParamLiveness *self,Expression **currp)

{
  _Rb_tree_header *p_Var1;
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *this;
  bool bVar2;
  char *__to;
  char *extraout_RDX;
  char *__to_00;
  char *extraout_RDX_00;
  Expression *pEVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pEVar3 = *currp;
  if (pEVar3->_id != BlockId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Block]");
  }
  if (pEVar3[1].type.id != 0) {
    pEVar3 = pEVar3 + 1;
    p_Var1 = &(self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
              super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
              branches._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = *(_Base_ptr *)
              ((long)&(self->
                      super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
                      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                      .branches._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar2]) {
      bVar2 = IString::operator<((IString *)(p_Var5 + 1),(IString *)pEVar3);
      if (!bVar2) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (bVar2 = IString::operator<((IString *)pEVar3,(IString *)(p_Var4 + 1)), p_Var5 = p_Var4,
       bVar2)) {
      p_Var5 = &p_Var1->_M_header;
    }
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_right != p_Var5[1]._M_left)) {
      this = (CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
             (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             currBasicBlock;
      startBasicBlock((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                       *)self);
      link(this,(char *)(self->
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
                        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                        .currBasicBlock,__to);
      p_Var4 = p_Var5[1]._M_right;
      __to_00 = extraout_RDX;
      for (p_Var5 = p_Var5[1]._M_left; p_Var5 != p_Var4; p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
        link(*(CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> **)
              p_Var5,(char *)(self->
                             super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                             ).
                             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                             .currBasicBlock,__to_00);
        __to_00 = extraout_RDX_00;
      }
      std::
      map<wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
      ::erase(&(self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               branches,(key_type *)pEVar3);
      return;
    }
  }
  return;
}

Assistant:

static void doEndBlock(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Block>();
    if (!curr->name.is()) {
      return;
    }
    auto iter = self->branches.find(curr->name);
    if (iter == self->branches.end()) {
      return;
    }
    auto& origins = iter->second;
    if (origins.size() == 0) {
      return;
    }
    // we have branches to here, so we need a new block
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    self->link(last, self->currBasicBlock); // fallthrough
    // branches to the new one
    for (auto* origin : origins) {
      self->link(origin, self->currBasicBlock);
    }
    self->branches.erase(curr->name);
  }